

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

node_t_conflict left_op(c2m_ctx_t c2m_ctx,int no_err_p,int token,int token2,nonterm_func_t f)

{
  int iVar1;
  node_t_conflict op1;
  node_t_conflict op;
  node_code_t code;
  pos_t pos;
  node_code_t local_44;
  pos_t local_40;
  
  op1 = (*f)(c2m_ctx,no_err_p);
  if (op1 != &err_struct) {
    while( true ) {
      iVar1 = match(c2m_ctx,token,&local_40,&local_44,(node_t_conflict *)0x0);
      if (iVar1 == 0) {
        if (token2 < 0) {
          return op1;
        }
        iVar1 = match(c2m_ctx,token2,&local_40,&local_44,(node_t_conflict *)0x0);
        if (iVar1 == 0) {
          return op1;
        }
      }
      op1 = new_pos_node1(c2m_ctx,local_44,local_40,op1);
      op = (*f)(c2m_ctx,no_err_p);
      if (op == &err_struct) break;
      op_append(c2m_ctx,op1,op);
    }
  }
  return &err_struct;
}

Assistant:

static node_t left_op (c2m_ctx_t c2m_ctx, int no_err_p, int token, int token2, nonterm_func_t f) {
  node_code_t code;
  node_t r, n;
  pos_t pos;

  P (f);
  while (MC (token, pos, code) || (token2 >= 0 && MC (token2, pos, code))) {
    n = new_pos_node1 (c2m_ctx, code, pos, r);
    P (f);
    op_append (c2m_ctx, n, r);
    r = n;
  }
  return r;
}